

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsTorqueConverter.cpp
# Opt level: O1

void __thiscall
chrono::ChShaftsTorqueConverter::VariablesFbLoadForces(ChShaftsTorqueConverter *this,double factor)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ulong *local_40;
  long local_38;
  double local_28;
  undefined8 uStack_20;
  
  dVar1 = this->torque_in;
  ChVariables::Get_fb((ChVectorRef *)&local_40,&(this->shaft1->variables).super_ChVariables);
  if (0 < local_38) {
    auVar7._8_8_ = 0;
    auVar7._0_8_ = factor;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = dVar1;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = *local_40;
    auVar6 = vfmadd213sd_fma(auVar10,auVar7,auVar6);
    *local_40 = auVar6._0_8_;
    dVar1 = this->torque_out;
    ChVariables::Get_fb((ChVectorRef *)&local_40,&(this->shaft2->variables).super_ChVariables);
    if (0 < local_38) {
      auVar8._8_8_ = 0;
      auVar8._0_8_ = factor;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = dVar1;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *local_40;
      auVar6 = vfmadd213sd_fma(auVar11,auVar8,auVar2);
      *local_40 = auVar6._0_8_;
      dVar1 = this->torque_in;
      local_28 = this->torque_out;
      uStack_20 = 0;
      ChVariables::Get_fb((ChVectorRef *)&local_40,
                          &(this->shaft_stator->variables).super_ChVariables);
      if (0 < local_38) {
        auVar5._8_8_ = uStack_20;
        auVar5._0_8_ = local_28;
        auVar4._8_8_ = 0x8000000000000000;
        auVar4._0_8_ = 0x8000000000000000;
        auVar6 = vxorpd_avx512vl(auVar5,auVar4);
        auVar12._8_8_ = 0;
        auVar12._0_8_ = factor;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = *local_40;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = auVar6._0_8_ - dVar1;
        auVar6 = vfmadd213sd_fma(auVar12,auVar9,auVar3);
        *local_40 = auVar6._0_8_;
        return;
      }
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 1>::operator()(Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 1]"
               );
}

Assistant:

void ChShaftsTorqueConverter::VariablesFbLoadForces(double factor) {
    // Apply torques to the three connected 1D variables:
    shaft1->Variables().Get_fb()(0) += torque_in * factor;
    shaft2->Variables().Get_fb()(0) += torque_out * factor;
    shaft_stator->Variables().Get_fb()(0) += GetTorqueReactionOnStator() * factor;
}